

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  XmlWriter *this_00;
  IConfig *pIVar1;
  undefined8 uVar2;
  allocator local_89;
  Ptr<Catch::IConfig> local_88;
  string local_80;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  ostream *local_20;
  
  local_20 = (this->m_config).m_stream;
  local_40._M_p = (pointer)&local_30;
  local_60[0] = false;
  local_60[1] = false;
  local_60._8_8_ = (pointer)0x0;
  local_60._16_8_ = (pointer)0x0;
  local_60._24_8_ = (pointer)0x0;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  this_00 = &this->m_xml;
  XmlWriter::operator=(this_00,(XmlWriter *)local_60);
  XmlWriter::~XmlWriter((XmlWriter *)local_60);
  std::__cxx11::string::string((string *)local_60,"Catch",(allocator *)&local_80);
  XmlWriter::startElement(this_00,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  pIVar1 = (this->m_config).m_fullConfig.m_p;
  local_80._M_dataplus._M_p = (pointer)pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
  }
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_60,pIVar1);
  uVar2 = local_60._8_8_;
  std::__cxx11::string::~string((string *)local_60);
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)&local_80);
  if ((pointer)uVar2 != (pointer)0x0) {
    std::__cxx11::string::string((string *)local_60,"name",&local_89);
    pIVar1 = (this->m_config).m_fullConfig.m_p;
    local_88.m_p = pIVar1;
    if (pIVar1 != (IConfig *)0x0) {
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(pIVar1);
    }
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_80,pIVar1);
    XmlWriter::writeAttribute(this_00,(string *)local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    Ptr<Catch::IConfig>::~Ptr(&local_88);
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml = XmlWriter( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }